

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

ostream * json::operator<<(ostream *os,Object *object)

{
  ostream *poVar1;
  string local_30 [32];
  
  (*(object->super_Type)._vptr_Type[1])(local_30);
  poVar1 = std::operator<<(os,local_30);
  std::__cxx11::string::~string(local_30);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, Object const& object) {
            return os << object.stringify();
        }